

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::ListDatatypeValidator::valueSpaceCheck
          (ListDatatypeValidator *this,BaseRefVectorOf<char16_t> *tokenVector,XMLCh *enumStr,
          MemoryManager *manager)

{
  int iVar1;
  DatatypeValidator *pDVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  uint local_5c;
  uint j;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> local_48;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> janName;
  BaseRefVectorOf<char16_t> *enumVector;
  DatatypeValidator *theItemTypeDTV;
  MemoryManager *manager_local;
  XMLCh *enumStr_local;
  BaseRefVectorOf<char16_t> *tokenVector_local;
  ListDatatypeValidator *this_local;
  
  pDVar2 = getItemTypeDTV(this);
  janName.fData = XMLString::tokenizeString(enumStr,manager);
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::Janitor(&local_48,janName.fData);
  XVar3 = BaseRefVectorOf<char16_t>::size(tokenVector);
  XVar4 = BaseRefVectorOf<char16_t>::size(janName.fData);
  if (XVar3 == XVar4) {
    local_5c = 0;
    while( true ) {
      XVar3 = BaseRefVectorOf<char16_t>::size(tokenVector);
      if (XVar3 <= local_5c) break;
      pcVar5 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,(ulong)local_5c);
      pcVar6 = BaseRefVectorOf<char16_t>::elementAt(janName.fData,(ulong)local_5c);
      iVar1 = (*(pDVar2->super_XSerializable)._vptr_XSerializable[10])(pDVar2,pcVar5,pcVar6,manager)
      ;
      if (iVar1 != 0) {
        this_local._7_1_ = false;
        goto LAB_003e8249;
      }
      local_5c = local_5c + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_003e8249:
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::~Janitor(&local_48);
  return this_local._7_1_;
}

Assistant:

bool ListDatatypeValidator::valueSpaceCheck(BaseRefVectorOf<XMLCh>* tokenVector
                                          , const XMLCh*    const  enumStr
                                          , MemoryManager*  const  manager) const
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(enumStr, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janName(enumVector);

    if (tokenVector->size() != enumVector->size())
        return false;

    for ( unsigned int j = 0; j < tokenVector->size(); j++ )
    {
        if (theItemTypeDTV->compare(tokenVector->elementAt(j), enumVector->elementAt(j), manager) != 0)
            return false;
    }

    return true;
}